

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_iterator.hpp
# Opt level: O0

void __thiscall
boost::algorithm::split_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>::
split_iterator<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
          (split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 Begin,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          End,token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *Finder)

{
  bool bVar1;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *in_RCX;
  split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *in_RDI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  char local_40 [4];
  int in_stack_ffffffffffffffc4;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *in_stack_ffffffffffffffc8;
  find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd0;
  
  last._M_current = local_40;
  detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::token_finderF(in_RDI,in_RCX);
  detail::find_iterator_base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>::
  find_iterator_base<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::~token_finderF
            ((token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)0x2ace49);
  iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>::
  iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_RDI,in_RSI,last);
  in_RDI[1].m_Pred.m_Size = (size_t)in_RSI._M_current;
  *(split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)&in_RDI[1].m_eCompress = in_RDX;
  in_RDI[2].m_Pred.m_Storage.m_fixSet[0] = '\0';
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_RDI,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_RCX);
  if (bVar1) {
    split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::increment(in_RDX);
  }
  return;
}

Assistant:

split_iterator(
                    IteratorT Begin,
                    IteratorT End,
                    FinderT Finder ) :
                detail::find_iterator_base<IteratorT>(Finder,0),
                m_Match(Begin,Begin),
                m_Next(Begin),
                m_End(End),
                m_bEof(false)
            {
                // force the correct behavior for empty sequences and yield at least one token
                if(Begin!=End)
                {
                    increment();
                }
            }